

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O2

int scv_i_grow(scv_vector *v,size_t capacity)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint __line;
  int iVar3;
  ulong uVar4;
  long lVar5;
  void *pvVar6;
  char *__assertion;
  ulong uVar7;
  
  if (v->data == (void *)0x0) {
    __assertion = "v->data != NULL";
    __line = 0x3b;
LAB_001078f3:
    __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c"
                  ,__line,"int scv_i_grow(struct scv_vector *, size_t)");
  }
  uVar7 = v->capacity;
  iVar3 = 0;
  if (uVar7 < capacity) {
    uVar1 = v->objsize;
    if (uVar1 == 0) {
      __assertion = "v->objsize > 0";
      __line = 0x41;
      goto LAB_001078f3;
    }
    if (capacity < 0xffffffffffffffff / uVar1) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar1;
      if (uVar7 < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / auVar2,0)) {
        lVar5 = uVar7 * 2;
      }
      else {
        lVar5 = (uVar7 >> 1) + uVar7;
      }
      uVar4 = lVar5 + 1;
      uVar7 = capacity;
      if (capacity < uVar4) {
        uVar7 = uVar4;
      }
      if (0xffffffffffffffff / uVar1 <= uVar4) {
        uVar7 = capacity;
      }
      pvVar6 = realloc(v->data,uVar1 * uVar7);
      if (pvVar6 == (void *)0x0) {
        iVar3 = -2;
      }
      else {
        v->data = pvVar6;
        v->capacity = uVar7;
        iVar3 = 0;
      }
    }
    else {
      iVar3 = -3;
    }
  }
  return iVar3;
}

Assistant:

static int scv_i_grow(struct scv_vector *v, size_t capacity)
{
	void *newdata;
	size_t newcapacity;

	assert(v != NULL);
	assert(v->data != NULL);

	if (capacity <= v->capacity) {
		return SCV_OK;
	}

	assert(v->objsize > 0);

	if (capacity >= (size_t) -1 / v->objsize) {
		return SCV_ERANGE;
	}

	/* Growth factor 2 for small vectors, 1.5 for larger */
	if (v->capacity < 4096 / v->objsize) {
		newcapacity = v->capacity + v->capacity + 1;
	}
	else {
		newcapacity = v->capacity + v->capacity / 2 + 1;
	}

	if (capacity > newcapacity || newcapacity >= (size_t) -1 / v->objsize) {
		newcapacity = capacity;
	}

	newdata = realloc(v->data, newcapacity * v->objsize);

	if (newdata == NULL) {
		return SCV_ENOMEM;
	}

	v->data = newdata;
	v->capacity = newcapacity;

	return SCV_OK;
}